

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_tests.cpp
# Opt level: O1

void __thiscall
crypto_tests::CryptoTest::
TestVector<CHMAC_SHA512,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          (CryptoTest *this,CHMAC_SHA512 *h,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *in,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *out)

{
  uchar *data;
  pointer puVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint64_t len;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  uint64_t maxval;
  ulong uVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  bool bVar10;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  vector<unsigned_char,_std::allocator<unsigned_char>_> hash;
  CHMAC_SHA512 hasher;
  check_type cVar11;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  assertion_result local_410;
  undefined1 *local_3f8;
  undefined1 *local_3f0;
  char *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  char *local_3a8;
  char *local_3a0;
  undefined1 *local_398;
  undefined1 *local_390;
  char *local_388;
  char *local_380;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_378;
  CHMAC_SHA512 local_358;
  undefined1 local_1c8 [16];
  undefined1 *local_1b8;
  char **local_1b0;
  CSHA512 local_100;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (uchar *)0x0;
  local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (uchar *)0x0;
  local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_380 = "";
  local_398 = &boost::unit_test::basic_cstring<char_const>::null;
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x25;
  file.m_begin = (iterator)&local_388;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_398,msg);
  local_358.outer.s[0] =
       CONCAT71(local_358.outer.s[0]._1_7_,
                (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start == 0x40);
  local_358.outer.s[1] = 0;
  local_358.outer.s[2] = 0;
  local_410._0_8_ = "out.size() == h.OUTPUT_SIZE";
  local_410.m_message.px = (element_type *)0xe7e231;
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_3a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_3a0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_1b0 = (char **)&local_410;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_358,(lazy_ostream *)local_1c8,1,0,WARN,_cVar11,
             (size_t)&local_3a8,0x25);
  boost::detail::shared_count::~shared_count((shared_count *)(local_358.outer.s + 2));
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&local_378,
             (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start);
  memcpy(local_1c8,h,400);
  data = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
         super__Vector_impl_data._M_start;
  CSHA512::Write(&local_100,data,
                 (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_finish - (long)data);
  CHMAC_SHA512::Finalize
            ((CHMAC_SHA512 *)local_1c8,
             local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x2a;
  file_00.m_begin = (iterator)&local_3b8;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_3c8,
             msg_00);
  puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start ==
      (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1) {
    if (local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start) {
      bVar10 = true;
    }
    else {
      iVar3 = bcmp(local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start,puVar1,
                   (long)local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                         ._M_impl.super__Vector_impl_data._M_start);
      bVar10 = iVar3 == 0;
    }
  }
  else {
    bVar10 = false;
  }
  local_358.outer.s[0] = CONCAT71(local_358.outer.s[0]._1_7_,bVar10);
  local_358.outer.s[1] = 0;
  local_358.outer.s[2] = 0;
  local_410._0_8_ = "hash == out";
  local_410.m_message.px = (element_type *)0xf92d81;
  local_1c8[8] = false;
  local_1c8._0_8_ = &PTR__lazy_ostream_013abc70;
  local_1b8 = boost::unit_test::lazy_ostream::inst;
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
  ;
  local_3d0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  local_1b0 = (char **)&local_410;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_358,(lazy_ostream *)local_1c8,1,0,WARN,_cVar11,
             (size_t)&local_3d8,0x2a);
  boost::detail::shared_count::~shared_count((shared_count *)(local_358.outer.s + 2));
  iVar3 = 0;
  do {
    memcpy(local_1c8,h,400);
    uVar8 = (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                  super__Vector_impl_data._M_start;
    if (uVar8 != 0) {
      uVar9 = 0;
      do {
        uVar8 = (uVar8 - uVar9) + 1 >> 1;
        if (uVar8 == 0) {
          uVar4 = 0x40;
        }
        else {
          lVar2 = 0x3f;
          if (uVar8 != 0) {
            for (; uVar8 >> lVar2 == 0; lVar2 = lVar2 + -1) {
            }
          }
          uVar4 = (uint)lVar2 ^ 0x3f;
        }
        do {
          len = RandomMixin<FastRandomContext>::randbits
                          (&(this->super_BasicTestingSetup).m_rng.
                            super_RandomMixin<FastRandomContext>,0x40 - uVar4);
        } while (uVar8 < len);
        CSHA512::Write(&local_100,
                       (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                       _M_impl.super__Vector_impl_data._M_start + uVar9,len);
        uVar9 = len + uVar9;
        if (uVar9 != 0) {
          puVar1 = (in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar1;
          if ((uVar8 < uVar9 + ((long)(out->
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(out->
                                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                     )._M_impl.super__Vector_impl_data._M_start) * 2) &&
             (uVar9 <= uVar8 && uVar8 - uVar9 != 0)) {
            memcpy(&local_358,local_1c8,400);
            CSHA512::Write(&local_358.inner,puVar1 + uVar9,uVar8 - uVar9);
            CHMAC_SHA512::Finalize
                      (&local_358,
                       local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_start);
            local_3e8 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
            ;
            local_3e0 = "";
            local_3f8 = &boost::unit_test::basic_cstring<char_const>::null;
            local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
            file_01.m_end = (iterator)0x37;
            file_01.m_begin = (iterator)&local_3e8;
            msg_01.m_end = pvVar7;
            msg_01.m_begin = pvVar6;
            boost::unit_test::unit_test_log_t::set_checkpoint
                      (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,
                       (size_t)&local_3f8,msg_01);
            puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            if ((long)local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start ==
                (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)puVar1) {
              if (local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish ==
                  local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start) {
                bVar10 = true;
              }
              else {
                iVar5 = bcmp(local_378.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_start,puVar1,
                             (long)local_378.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                             (long)local_378.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_start);
                bVar10 = iVar5 == 0;
              }
            }
            else {
              bVar10 = false;
            }
            local_410.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.
            value = (readonly_property<bool>)(readonly_property<bool>)bVar10;
            local_410.m_message.px = (element_type *)0x0;
            local_410.m_message.pn.pi_ = (sp_counted_base *)0x0;
            local_420 = "hash == out";
            local_418 = "";
            local_358.outer.s[1] = local_358.outer.s[1] & 0xffffffffffffff00;
            local_358.outer.s[0] = (uint64_t)&PTR__lazy_ostream_013abc70;
            local_358.outer.s[2] = (uint64_t)boost::unit_test::lazy_ostream::inst;
            local_358.outer.s[3] = (uint64_t)&local_420;
            local_430 = 
            "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
            ;
            local_428 = "";
            pvVar6 = (iterator)0x1;
            pvVar7 = (iterator)0x0;
            boost::test_tools::tt_detail::report_assertion
                      (&local_410,(lazy_ostream *)&local_358,1,0,WARN,_cVar11,(size_t)&local_430,
                       0x37);
            boost::detail::shared_count::~shared_count(&local_410.m_message.pn);
          }
        }
        uVar8 = (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(in->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                      _M_impl.super__Vector_impl_data._M_start;
      } while (uVar9 < uVar8);
    }
    CHMAC_SHA512::Finalize
              ((CHMAC_SHA512 *)local_1c8,
               local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start);
    local_440 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_438 = "";
    local_450 = &boost::unit_test::basic_cstring<char_const>::null;
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    file_02.m_end = (iterator)0x3b;
    file_02.m_begin = (iterator)&local_440;
    msg_02.m_end = pvVar7;
    msg_02.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_450,
               msg_02);
    puVar1 = (out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start ==
        (long)(out->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish - (long)puVar1) {
      if (local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        bVar10 = true;
      }
      else {
        iVar5 = bcmp(local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start,puVar1,
                     (long)local_378.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)local_378.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_start);
        bVar10 = iVar5 == 0;
      }
    }
    else {
      bVar10 = false;
    }
    local_410.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
         (readonly_property<bool>)(readonly_property<bool>)bVar10;
    local_410.m_message.px = (element_type *)0x0;
    local_410.m_message.pn.pi_ = (sp_counted_base *)0x0;
    local_420 = "hash == out";
    local_418 = "";
    local_358.outer.s[1] = local_358.outer.s[1] & 0xffffffffffffff00;
    local_358.outer.s[0] = (uint64_t)&PTR__lazy_ostream_013abc70;
    local_358.outer.s[2] = (uint64_t)boost::unit_test::lazy_ostream::inst;
    local_358.outer.s[3] = (uint64_t)&local_420;
    local_460 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/crypto_tests.cpp"
    ;
    local_458 = "";
    pvVar6 = (iterator)0x1;
    pvVar7 = (iterator)0x0;
    boost::test_tools::tt_detail::report_assertion
              (&local_410,(lazy_ostream *)&local_358,1,0,WARN,_cVar11,(size_t)&local_460,0x3b);
    boost::detail::shared_count::~shared_count(&local_410.m_message.pn);
    iVar3 = iVar3 + 1;
  } while (iVar3 != 0x20);
  if (local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (uchar *)0x0) {
    operator_delete(local_378.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_378.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_378.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void TestVector(const Hasher &h, const In &in, const Out &out) {
    Out hash;
    BOOST_CHECK(out.size() == h.OUTPUT_SIZE);
    hash.resize(out.size());
    {
        // Test that writing the whole input string at once works.
        Hasher(h).Write((const uint8_t*)in.data(), in.size()).Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
    for (int i=0; i<32; i++) {
        // Test that writing the string broken up in random pieces works.
        Hasher hasher(h);
        size_t pos = 0;
        while (pos < in.size()) {
            size_t len = m_rng.randrange((in.size() - pos + 1) / 2 + 1);
            hasher.Write((const uint8_t*)in.data() + pos, len);
            pos += len;
            if (pos > 0 && pos + 2 * out.size() > in.size() && pos < in.size()) {
                // Test that writing the rest at once to a copy of a hasher works.
                Hasher(hasher).Write((const uint8_t*)in.data() + pos, in.size() - pos).Finalize(hash.data());
                BOOST_CHECK(hash == out);
            }
        }
        hasher.Finalize(hash.data());
        BOOST_CHECK(hash == out);
    }
}